

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_tcache_fill_small
               (tsdn_t *tsdn,arena_t *arena,tcache_t *tcache,cache_bin_t *tbin,szind_t binind,
               uint64_t prof_accumbytes)

{
  uint64_t *puVar1;
  extent_t *peVar2;
  ulong uVar3;
  void **ppvVar4;
  size_t sVar5;
  tsd_t *tsdn_00;
  bin_t *bin;
  void *pvVar6;
  arena_tdata_t *paVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  bitmap_t bVar17;
  ulong uVar18;
  uint binshard;
  ulong local_58;
  tsd_t *local_50;
  long local_48;
  long local_40;
  bin_info_t *local_38;
  
  local_50 = &tsdn->tsd;
  bin = arena_bin_choose_lock(tsdn,arena,binind,&binshard);
  uVar13 = tcache_bin_info[binind].ncached_max >> (tcache->lg_fill_div[binind] & 0x1f);
  if (uVar13 == 0) {
LAB_0010e76d:
    uVar16 = 0;
  }
  else {
    local_40 = -(ulong)uVar13;
    local_38 = bin_infos + binind;
    uVar16 = 0;
    local_48 = (ulong)uVar13 * -8;
    do {
      peVar2 = bin->slabcur;
      iVar15 = (int)uVar16;
      if (peVar2 == (extent_t *)0x0) {
LAB_0010e6cf:
        pvVar6 = arena_bin_malloc_hard((tsdn_t *)local_50,arena,bin,binind,binshard);
        if (pvVar6 == (void *)0x0) {
          if (iVar15 == 0) goto LAB_0010e76d;
          memmove(tbin->avail + -uVar16,tbin->avail + local_40,uVar16 * 8);
          break;
        }
        *(void **)((long)tbin->avail + uVar16 * 8 + local_48) = pvVar6;
        uVar8 = 1;
      }
      else {
        uVar3 = peVar2->e_bits;
        uVar8 = (uint)(uVar3 >> 0x1a) & 0x3ff;
        if ((uVar3 >> 0x1a & 0x3ff) == 0) goto LAB_0010e6cf;
        uVar12 = uVar13 - iVar15;
        ppvVar4 = tbin->avail;
        if ((uVar12 < uVar8) && (uVar8 = uVar12, uVar12 == 0)) {
          uVar8 = 0;
        }
        else {
          bVar17 = (peVar2->field_5).e_slab_data.bitmap[0];
          uVar14 = 0;
          uVar12 = 0;
          do {
            while (bVar17 == 0) {
              uVar14 = (ulong)((int)uVar14 + 1);
              bVar17 = *(ulong *)((long)&peVar2->field_5 + uVar14 * 8);
            }
            uVar11 = uVar8 - uVar12;
            local_58 = uVar3;
            if (uVar11 == 0) {
              *(bitmap_t *)((long)&peVar2->field_5 + uVar14 * 8) = bVar17;
              break;
            }
            pvVar6 = peVar2->e_addr;
            sVar5 = local_38->reg_size;
            uVar18 = bVar17 - (bVar17 >> 1 & 0x5555555555555555);
            uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
            uVar9 = (uint)(byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38);
            if (uVar11 < uVar9) {
              uVar9 = uVar11;
            }
            lVar10 = -(ulong)uVar9;
            do {
              uVar18 = 0;
              if (bVar17 != 0) {
                for (; (bVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              if (bVar17 == 0) {
                uVar18 = 0xffffffff;
              }
              bVar17 = bVar17 ^ 1L << (uVar18 & 0x3f);
              *(void **)((long)ppvVar4 + (ulong)uVar12 * 8 + uVar16 * 8 + local_48) =
                   (void *)((uVar18 + (uint)((int)uVar14 << 6)) * sVar5 + (long)pvVar6);
              uVar12 = uVar12 + 1;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0);
            *(bitmap_t *)((long)&peVar2->field_5 + uVar14 * 8) = bVar17;
          } while (uVar12 < uVar8);
        }
        peVar2->e_bits = uVar3 + (ulong)uVar8 * -0x4000000;
      }
      uVar16 = (ulong)(iVar15 + uVar8);
    } while (iVar15 + uVar8 < uVar13);
  }
  (bin->stats).nmalloc = (bin->stats).nmalloc + uVar16;
  puVar1 = &(bin->stats).nrequests;
  *puVar1 = *puVar1 + (tbin->tstats).nrequests;
  (bin->stats).curregs = uVar16 + (bin->stats).curregs;
  (bin->stats).nfills = (bin->stats).nfills + 1;
  (tbin->tstats).nrequests = 0;
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
  tsdn_00 = local_50;
  tbin->ncached = (cache_bin_sz_t)uVar16;
  if (local_50 != (tsd_t *)0x0) {
    uVar13 = arena->base->ind;
    if ((local_50->cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata ==
         (arena_tdata_t *)0x0) ||
       (local_50->cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= uVar13)) {
      paVar7 = arena_tdata_get_hard(local_50,uVar13);
    }
    else {
      paVar7 = local_50->cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata + uVar13
      ;
    }
    if ((paVar7 != (arena_tdata_t *)0x0) &&
       (iVar15 = (paVar7->decay_ticker).tick, (paVar7->decay_ticker).tick = iVar15 + -1, iVar15 < 1)
       ) {
      (paVar7->decay_ticker).tick = (paVar7->decay_ticker).nticks;
      arena_decay((tsdn_t *)tsdn_00,arena,false,false);
      return;
    }
  }
  return;
}

Assistant:

void
arena_tcache_fill_small(tsdn_t *tsdn, arena_t *arena, tcache_t *tcache,
    cache_bin_t *tbin, szind_t binind, uint64_t prof_accumbytes) {
	unsigned i, nfill, cnt;

	assert(tbin->ncached == 0);

	if (config_prof && arena_prof_accum(tsdn, arena, prof_accumbytes)) {
		prof_idump(tsdn);
	}

	unsigned binshard;
	bin_t *bin = arena_bin_choose_lock(tsdn, arena, binind, &binshard);

	for (i = 0, nfill = (tcache_bin_info[binind].ncached_max >>
	    tcache->lg_fill_div[binind]); i < nfill; i += cnt) {
		extent_t *slab;
		if ((slab = bin->slabcur) != NULL && extent_nfree_get(slab) >
		    0) {
			unsigned tofill = nfill - i;
			cnt = tofill < extent_nfree_get(slab) ?
				tofill : extent_nfree_get(slab);
			arena_slab_reg_alloc_batch(
			   slab, &bin_infos[binind], cnt,
			   tbin->avail - nfill + i);
		} else {
			cnt = 1;
			void *ptr = arena_bin_malloc_hard(tsdn, arena, bin,
			    binind, binshard);
			/*
			 * OOM.  tbin->avail isn't yet filled down to its first
			 * element, so the successful allocations (if any) must
			 * be moved just before tbin->avail before bailing out.
			 */
			if (ptr == NULL) {
				if (i > 0) {
					memmove(tbin->avail - i,
						tbin->avail - nfill,
						i * sizeof(void *));
				}
				break;
			}
			/* Insert such that low regions get used first. */
			*(tbin->avail - nfill + i) = ptr;
		}
		if (config_fill && unlikely(opt_junk_alloc)) {
			for (unsigned j = 0; j < cnt; j++) {
				void* ptr = *(tbin->avail - nfill + i + j);
				arena_alloc_junk_small(ptr, &bin_infos[binind],
							true);
			}
		}
	}
	if (config_stats) {
		bin->stats.nmalloc += i;
		bin->stats.nrequests += tbin->tstats.nrequests;
		bin->stats.curregs += i;
		bin->stats.nfills++;
		tbin->tstats.nrequests = 0;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);
	tbin->ncached = i;
	arena_decay_tick(tsdn, arena);
}